

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float *pfVar1;
  State *pSVar2;
  ostream *poVar3;
  result_type rVar4;
  double dVar5;
  undefined1 local_2dc [8];
  PositionMeasurement position;
  OrientationMeasurement orientation;
  State x_ukf;
  State x_ekf;
  State x_pred;
  ulong local_2a0;
  size_t i;
  size_t N;
  T distanceNoise;
  T orientationNoise;
  T systemNoise;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> ukf;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> ekf;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> predictor;
  normal_distribution<float> noise;
  default_random_engine generator;
  OrientationModel om;
  undefined1 local_108 [8];
  PositionModel pm;
  SystemModel sys;
  Control u;
  State x;
  char **argv_local;
  int argc_local;
  
  KalmanExamples::Robot1::State<float>::State((State<float> *)&u);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&u);
  KalmanExamples::Robot1::Control<float>::Control
            ((Control<float> *)
             &sys.
              super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
              .field_0x74);
  KalmanExamples::Robot1::SystemModel<float,_Kalman::StandardBase>::SystemModel
            ((SystemModel<float,_Kalman::StandardBase> *)&pm.landmark2);
  KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
  PositionMeasurementModel
            ((PositionMeasurementModel<float,_Kalman::StandardBase> *)local_108,-10.0,-10.0,30.0,
             75.0);
  KalmanExamples::Robot1::OrientationMeasurementModel<float,_Kalman::StandardBase>::
  OrientationMeasurementModel
            ((OrientationMeasurementModel<float,_Kalman::StandardBase> *)&generator);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &noise._M_saved);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::seed
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &noise._M_saved,0x1b207);
  std::normal_distribution<float>::normal_distribution
            ((normal_distribution<float> *)
             ((long)&predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c),0.0,1.0);
  Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_>::ExtendedKalmanFilter
            ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)
             ((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c));
  Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_>::ExtendedKalmanFilter
            ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)
             ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c));
  Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)&orientationNoise,1.0,
             2.0,0.0);
  Kalman::KalmanFilterBase<KalmanExamples::Robot1::State<float>_>::init
            ((KalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)
             ((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c),(EVP_PKEY_CTX *)&u);
  Kalman::KalmanFilterBase<KalmanExamples::Robot1::State<float>_>::init
            ((KalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)
             ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                     super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
             0x1c),(EVP_PKEY_CTX *)&u);
  Kalman::KalmanFilterBase<KalmanExamples::Robot1::State<float>_>::init
            ((KalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)&orientationNoise,
             (EVP_PKEY_CTX *)&u);
  for (local_2a0 = 1; local_2a0 < 0x65; local_2a0 = local_2a0 + 1) {
    dVar5 = std::sin(5.09798338773104e-315);
    pfVar1 = KalmanExamples::Robot1::Control<float>::v
                       ((Control<float> *)
                        &sys.
                         super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         .field_0x74);
    *pfVar1 = SUB84(dVar5,0) + 1.0;
    dVar5 = std::sin(5.09798338773104e-315);
    pfVar1 = KalmanExamples::Robot1::Control<float>::dtheta
                       ((Control<float> *)
                        &sys.
                         super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         .field_0x74);
    *pfVar1 = SUB84(dVar5,0) * (float)(int)((uint)(0x32 < local_2a0) * -2 + 1);
    KalmanExamples::Robot1::SystemModel<float,_Kalman::StandardBase>::f
              ((SystemModel<float,_Kalman::StandardBase> *)
               ((long)x_pred.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 4),(S *)&pm.landmark2,&u);
    KalmanExamples::Robot1::State<float>::operator=
              ((State<float> *)&u,
               (State<float> *)
               ((long)x_pred.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 4));
    rVar4 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       ((long)&predictor.
                               super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                               super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &noise._M_saved);
    pfVar1 = KalmanExamples::Robot1::State<float>::x((State<float> *)&u);
    *pfVar1 = rVar4 * 0.1 + *pfVar1;
    rVar4 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       ((long)&predictor.
                               super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                               super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &noise._M_saved);
    pfVar1 = KalmanExamples::Robot1::State<float>::y((State<float> *)&u);
    *pfVar1 = rVar4 * 0.1 + *pfVar1;
    rVar4 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       ((long)&predictor.
                               super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                               super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &noise._M_saved);
    pfVar1 = KalmanExamples::Robot1::State<float>::theta((State<float> *)&u);
    *pfVar1 = rVar4 * 0.1 + *pfVar1;
    pSVar2 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x1c),
                        (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         *)&pm.landmark2,
                        (Control<float> *)
                        &sys.
                         super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         .field_0x74);
    KalmanExamples::Robot1::State<float>::State
              ((State<float> *)
               ((long)x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    pSVar2 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x1c),
                        (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         *)&pm.landmark2,
                        (Control<float> *)
                        &sys.
                         super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         .field_0x74);
    KalmanExamples::Robot1::State<float>::State
              ((State<float> *)
               ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    pSVar2 = Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        &orientationNoise,
                        (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         *)&pm.landmark2,
                        (Control<float> *)
                        &sys.
                         super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         .field_0x74);
    KalmanExamples::Robot1::State<float>::State
              ((State<float> *)
               ((long)position.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    KalmanExamples::Robot1::OrientationMeasurementModel<float,_Kalman::StandardBase>::h
              ((OrientationMeasurementModel<float,_Kalman::StandardBase> *)&position,(S *)&generator
              );
    rVar4 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       ((long)&predictor.
                               super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                               super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &noise._M_saved);
    pfVar1 = KalmanExamples::Robot1::OrientationMeasurement<float>::theta
                       ((OrientationMeasurement<float> *)&position);
    *pfVar1 = rVar4 * 0.025 + *pfVar1;
    pSVar2 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x1c),
                        (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                         *)&generator,(OrientationMeasurement<float> *)&position);
    KalmanExamples::Robot1::State<float>::operator=
              ((State<float> *)
               ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    pSVar2 = Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        &orientationNoise,
                        (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                         *)&generator,(OrientationMeasurement<float> *)&position);
    KalmanExamples::Robot1::State<float>::operator=
              ((State<float> *)
               ((long)position.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::h
              ((PositionMeasurementModel<float,_Kalman::StandardBase> *)local_2dc,(S *)local_108);
    rVar4 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       ((long)&predictor.
                               super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                               super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &noise._M_saved);
    pfVar1 = KalmanExamples::Robot1::PositionMeasurement<float>::d1
                       ((PositionMeasurement<float> *)local_2dc);
    *pfVar1 = rVar4 * 0.25 + *pfVar1;
    rVar4 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)
                       ((long)&predictor.
                               super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                               super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &noise._M_saved);
    pfVar1 = KalmanExamples::Robot1::PositionMeasurement<float>::d2
                       ((PositionMeasurement<float> *)local_2dc);
    *pfVar1 = rVar4 * 0.25 + *pfVar1;
    pSVar2 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x1c),
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)local_108,(PositionMeasurement<float> *)local_2dc);
    KalmanExamples::Robot1::State<float>::operator=
              ((State<float> *)
               ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    pSVar2 = Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        &orientationNoise,
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)local_108,(PositionMeasurement<float> *)local_2dc);
    KalmanExamples::Robot1::State<float>::operator=
              ((State<float> *)
               ((long)position.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array + 4),pSVar2);
    pfVar1 = KalmanExamples::Robot1::State<float>::x((State<float> *)&u);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::y((State<float> *)&u);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::theta((State<float> *)&u);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::x
                       ((State<float> *)
                        ((long)x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::y
                       ((State<float> *)
                        ((long)x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::theta
                       ((State<float> *)
                        ((long)x_ekf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::x
                       ((State<float> *)
                        ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::y
                       ((State<float> *)
                        ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::theta
                       ((State<float> *)
                        ((long)x_ukf.super_Vector<float,_3>.super_Matrix<float,_3,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::x
                       ((State<float> *)
                        ((long)position.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::y
                       ((State<float> *)
                        ((long)position.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    poVar3 = std::operator<<(poVar3,",");
    pfVar1 = KalmanExamples::Robot1::State<float>::theta
                       ((State<float> *)
                        ((long)position.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                               .m_data.array + 4));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar1);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  KalmanExamples::Robot1::OrientationMeasurementModel<float,_Kalman::StandardBase>::
  ~OrientationMeasurementModel
            ((OrientationMeasurementModel<float,_Kalman::StandardBase> *)&generator);
  KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
  ~PositionMeasurementModel((PositionMeasurementModel<float,_Kalman::StandardBase> *)local_108);
  KalmanExamples::Robot1::SystemModel<float,_Kalman::StandardBase>::~SystemModel
            ((SystemModel<float,_Kalman::StandardBase> *)&pm.landmark2);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Simulated (true) system state
    State x;
    x.setZero();
    
    // Control input
    Control u;
    // System
    SystemModel sys;
    
    // Measurement models
    // Set position landmarks at (-10, -10) and (30, 75)
    PositionModel pm(-10, -10, 30, 75);
    OrientationModel om;
    
    // Random number generation (for noise simulation)
    std::default_random_engine generator;
    generator.seed( 111111 );
    std::normal_distribution<T> noise(0, 1);
    
    // Some filters for estimation
    // Pure predictor without measurement updates
    Kalman::ExtendedKalmanFilter<State> predictor;
    // Extended Kalman Filter
    Kalman::ExtendedKalmanFilter<State> ekf;
    // Unscented Kalman Filter
    Kalman::UnscentedKalmanFilter<State> ukf(1);
    
    // Init filters with true system state
    predictor.init(x);
    ekf.init(x);
    ukf.init(x);
    
    // Standard-Deviation of noise added to all state vector components during state transition
    T systemNoise = 0.1;
    // Standard-Deviation of noise added to all measurement vector components in orientation measurements
    T orientationNoise = 0.025;
    // Standard-Deviation of noise added to all measurement vector components in distance measurements
    T distanceNoise = 0.25;
    
    // Simulate for 100 steps
    const size_t N = 100;
    for(size_t i = 1; i <= N; i++)
    {
        // Generate some control input
        u.v() = 1. + std::sin( T(2) * T(M_PI) / T(N) );
        u.dtheta() = std::sin( T(2) * T(M_PI) / T(N) ) * (1 - 2*(i > 50));
        
        // Simulate system
        x = sys.f(x, u);
        
        // Add noise: Our robot move is affected by noise (due to actuator failures)
        x.x() += systemNoise*noise(generator);
        x.y() += systemNoise*noise(generator);
        x.theta() += systemNoise*noise(generator);
        
        // Predict state for current time-step using the filters
        auto x_pred = predictor.predict(sys, u);
        auto x_ekf = ekf.predict(sys, u);
        auto x_ukf = ukf.predict(sys, u);
        
        // Orientation measurement
        {
            // We can measure the orientation every 5th step
            OrientationMeasurement orientation = om.h(x);
            
            // Measurement is affected by noise as well
            orientation.theta() += orientationNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(om, orientation);
            
            // Update UKF
            x_ukf = ukf.update(om, orientation);
        }
        
        // Position measurement
        {
            // We can measure the position every 10th step
            PositionMeasurement position = pm.h(x);
            
            // Measurement is affected by noise as well
            position.d1() += distanceNoise * noise(generator);
            position.d2() += distanceNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(pm, position);
            
            // Update UKF
            x_ukf = ukf.update(pm, position);
        }
        
        // Print to stdout as csv format
        std::cout   << x.x() << "," << x.y() << "," << x.theta() << ","
                    << x_pred.x() << "," << x_pred.y() << "," << x_pred.theta()  << ","
                    << x_ekf.x() << "," << x_ekf.y() << "," << x_ekf.theta()  << ","
                    << x_ukf.x() << "," << x_ukf.y() << "," << x_ukf.theta()
                    << std::endl;
    }
    
    return 0;
}